

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::WFXMLScanner::scanStartTag(WFXMLScanner *this,bool *gotData)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *this_00;
  XMLDocumentHandler *pXVar2;
  bool bVar3;
  XMLCh toCheck;
  XMLSize_t XVar4;
  DTDElementDecl *pDVar5;
  XMLCh *pXVar6;
  XMLReader *pXVar7;
  unsigned_long *puVar8;
  XMLAttr *pXVar9;
  UnexpectedEOFException *this_01;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar10;
  MemoryManager *in_stack_fffffffffffffef0;
  undefined4 uVar11;
  XMLAttr *curAtt;
  XMLSize_t XStack_78;
  XMLCh chFound_1;
  XMLSize_t k;
  XMLSize_t attNameHash;
  XMLCh *attNameRawBuf;
  XMLCh chFound;
  bool bFoundSpace;
  XMLSize_t XStack_58;
  XMLCh nextCh;
  XMLSize_t curAttListSize;
  XMLSize_t attCount;
  DTDElementDecl *local_38;
  XMLElementDecl *elemDecl;
  XMLCh *qnameRawBuf;
  bool isRoot;
  bool *pbStack_20;
  bool isEmpty;
  bool *gotData_local;
  WFXMLScanner *this_local;
  
  *gotData = true;
  pbStack_20 = gotData;
  gotData_local = (bool *)this;
  bVar3 = ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,
                             &(this->super_XMLScanner).fQNameBuf);
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    ReaderMgr::skipToChar(&(this->super_XMLScanner).fReaderMgr,L'<');
    return false;
  }
  qnameRawBuf._7_1_ = 0;
  qnameRawBuf._6_1_ = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  elemDecl = (XMLElementDecl *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
  local_38 = (DTDElementDecl *)
             RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::get
                       (this->fElementLookup,elemDecl);
  if (local_38 == (DTDElementDecl *)0x0) {
    uVar1 = this->fElementIndex;
    XVar4 = BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::size
                      (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>);
    if (uVar1 < XVar4) {
      local_38 = (DTDElementDecl *)
                 BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::elementAt
                           (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>,
                            (ulong)this->fElementIndex);
    }
    else {
      pDVar5 = (DTDElementDecl *)
               XMemory::operator_new(0x58,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      DTDElementDecl::DTDElementDecl(pDVar5,(this->super_XMLScanner).fGrammarPoolMemoryManager);
      local_38 = pDVar5;
      BaseRefVectorOf<xercesc_4_0::XMLElementDecl>::addElement
                (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>,
                 (XMLElementDecl *)pDVar5);
    }
    XMLElementDecl::setElementName
              (&local_38->super_XMLElementDecl,L"",(XMLCh *)elemDecl,
               (this->super_XMLScanner).fEmptyNamespaceId);
    this_00 = this->fElementLookup;
    pXVar6 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
    RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::put
              (this_00,pXVar6,&local_38->super_XMLElementDecl);
    this->fElementIndex = this->fElementIndex + 1;
  }
  pDVar5 = local_38;
  XVar4 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  ElemStack::addLevel(&(this->super_XMLScanner).fElemStack,&pDVar5->super_XMLElementDecl,XVar4);
  ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
  curAttListSize = 0;
  XStack_58 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::size
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
LAB_0037a1c4:
  attNameRawBuf._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
  if (((curAttListSize != 0) && (attNameRawBuf._6_2_ != L'/')) && (attNameRawBuf._6_2_ != L'>')) {
    ReaderMgr::skipPastSpaces
              (&(this->super_XMLScanner).fReaderMgr,(bool *)((long)&attNameRawBuf + 5),false);
    if ((attNameRawBuf._5_1_ & 1) == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    }
    attNameRawBuf._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
  }
  pXVar7 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
  bVar3 = XMLReader::isSpecialStartTagChar(pXVar7,attNameRawBuf._6_2_);
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (!bVar3) {
    bVar3 = ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,
                               &(this->super_XMLScanner).fAttNameBuf);
    if (!bVar3) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      return false;
    }
    bVar3 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    if (!bVar3) goto code_r0x0037a2cd;
    goto LAB_0037a38b;
  }
  if (attNameRawBuf._6_2_ == L'\0') {
    this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
               ,0x3d8,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,
                UnexpectedEOFException::~UnexpectedEOFException);
  }
  if (attNameRawBuf._6_2_ == L'/') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    qnameRawBuf._7_1_ = 1;
    bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    if (!bVar3) {
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,(XMLCh *)elemDecl,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  else if (attNameRawBuf._6_2_ == L'>') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
  }
  else {
    if (attNameRawBuf._6_2_ != L'<') {
      if ((attNameRawBuf._6_2_ == L'\'') || (attNameRawBuf._6_2_ == L'\"')) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
        ReaderMgr::skipQuotedString(&(this->super_XMLScanner).fReaderMgr,attNameRawBuf._6_2_);
        ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      }
      goto LAB_0037a1c4;
    }
    pXVar6 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedStartTag,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (((qnameRawBuf._7_1_ & 1) != 0) &&
     (ElemStack::popTop(&(this->super_XMLScanner).fElemStack), (qnameRawBuf._6_1_ & 1) != 0)) {
    *pbStack_20 = false;
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    pXVar2 = (this->super_XMLScanner).fDocHandler;
    (*pXVar2->_vptr_XMLDocumentHandler[0xb])
              (pXVar2,local_38,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
               (this->super_XMLScanner).fAttrList,curAttListSize,
               CONCAT44(uVar10,(uint)(qnameRawBuf._7_1_ & 1)),
               CONCAT44(uVar11,(uint)(qnameRawBuf._6_1_ & 1)));
  }
  return true;
code_r0x0037a2cd:
  XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
  attNameRawBuf._2_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"\'\"></");
  if ((attNameRawBuf._2_2_ != L'>') && (attNameRawBuf._2_2_ != L'/')) {
    if ((attNameRawBuf._2_2_ != L'\'') && (attNameRawBuf._2_2_ != L'\"')) {
      pXVar7 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar3 = XMLReader::isWhitespace(pXVar7,attNameRawBuf._2_2_);
      if (!bVar3) {
        if (attNameRawBuf._2_2_ != L'<') {
          return false;
        }
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,(XMLCh *)elemDecl,(XMLCh *)0x0,
                   (XMLCh *)0x0,(XMLCh *)0x0);
        return false;
      }
    }
LAB_0037a38b:
    attNameHash = (XMLSize_t)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
    k = XMLString::hash((XMLCh *)attNameHash,0x6d);
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (curAttListSize != 0) {
      for (XStack_78 = 0; uVar10 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20),
          XStack_78 < curAttListSize; XStack_78 = XStack_78 + 1) {
        puVar8 = ValueVectorOf<unsigned_long>::elementAt(this->fAttrNameHashList,XStack_78);
        if (*puVar8 == k) {
          pXVar9 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                             (&((this->super_XMLScanner).fAttrList)->
                               super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XStack_78);
          pXVar6 = XMLAttr::getName(pXVar9);
          bVar3 = XMLString::equals(pXVar6,(XMLCh *)attNameHash);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          if (bVar3) {
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,(XMLCh *)attNameHash,
                       (XMLCh *)elemDecl,(XMLCh *)0x0,(XMLCh *)0x0);
            break;
          }
        }
      }
    }
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar3 = scanAttValue(this,(XMLCh *)attNameHash,&(this->super_XMLScanner).fAttValueBuf);
    if (!bVar3) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      toCheck = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"></");
      if ((toCheck != L'>') && (toCheck != L'/')) {
        pXVar7 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar3 = XMLReader::isWhitespace(pXVar7,toCheck);
        if (!bVar3) {
          if (toCheck != L'<') {
            return false;
          }
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,(XMLCh *)elemDecl,(XMLCh *)0x0,
                     (XMLCh *)0x0,(XMLCh *)0x0);
          return false;
        }
      }
    }
    if (curAttListSize < XStack_58) {
      pXVar9 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                         (&((this->super_XMLScanner).fAttrList)->
                           super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,curAttListSize);
      XVar4 = attNameHash;
      pXVar6 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
      in_stack_fffffffffffffee8 = 0;
      in_stack_fffffffffffffef0 =
           (MemoryManager *)((ulong)in_stack_fffffffffffffef0 & 0xffffffff00000000);
      XMLAttr::set(pXVar9,0,(XMLCh *)XVar4,L"",pXVar6,AttTypes_Min,(DatatypeValidator *)0x0,false);
      XMLAttr::setSpecified(pXVar9,true);
      ValueVectorOf<unsigned_long>::setElementAt(this->fAttrNameHashList,&k,curAttListSize);
    }
    else {
      pXVar9 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      XVar4 = attNameHash;
      pXVar6 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
      in_stack_fffffffffffffef0 = (this->super_XMLScanner).fMemoryManager;
      in_stack_fffffffffffffee8 = CONCAT44(uVar10,1);
      XMLAttr::XMLAttr(pXVar9,0,(XMLCh *)XVar4,L"",pXVar6,AttTypes_Min,true,
                       in_stack_fffffffffffffef0,(DatatypeValidator *)0x0,false);
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 pXVar9);
      ValueVectorOf<unsigned_long>::addElement(this->fAttrNameHashList,&k);
    }
    curAttListSize = curAttListSize + 1;
  }
  goto LAB_0037a1c4;
}

Assistant:

bool WFXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fElementLookup->get(qnameRawBuf);

    if (!elemDecl) {

        if (fElementIndex < fElements->size()) {
            elemDecl = fElements->elementAt(fElementIndex);
        }
        else {
            elemDecl = new (fGrammarPoolMemoryManager) DTDElementDecl
            (
                fGrammarPoolMemoryManager
            );
            fElements->addElement(elemDecl);
        }

        elemDecl->setElementName(XMLUni::fgZeroLenString, qnameRawBuf, fEmptyNamespaceId);
        fElementLookup->put((void*)elemDecl->getFullName(), elemDecl);
        fElementIndex++;
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared more than one for this element.
            const XMLCh* attNameRawBuf = fAttNameBuf.getRawBuffer();
            XMLSize_t attNameHash = XMLString::hash(attNameRawBuf, 109);

            if (attCount) {

                for (XMLSize_t k=0; k < attCount; k++) {

                    if (fAttrNameHashList->elementAt(k) == attNameHash) {
                        if (
                               XMLString::equals
                               (
                                   fAttrList->elementAt(k)->getName()
                                   , attNameRawBuf
                               )
                           )
                        {
                            emitError
                            (
                                XMLErrs::AttrAlreadyUsedInSTag
                                , attNameRawBuf
                                , qnameRawBuf
                            );
                            break;
                        }
                    }
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attNameRawBuf, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , attNameRawBuf
                    , XMLUni::fgZeroLenString
                    , fAttValueBuf.getRawBuffer()
                    , XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
                fAttrNameHashList->addElement(attNameHash);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , attNameRawBuf
                    , XMLUni::fgZeroLenString
                    , fAttValueBuf.getRawBuffer()
                );
                curAtt->setSpecified(true);
                fAttrNameHashList->setElementAt(attNameHash, attCount);
            }
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, qnameRawBuf);
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}